

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O3

int blake2b_update(blake2b_state *S,uint8_t *in,uint64_t inlen)

{
  uint8_t *block;
  ulong uVar1;
  ulong __n;
  size_t sVar2;
  
  if (inlen != 0) {
    block = S->buf;
    sVar2 = S->buflen;
    do {
      __n = 0x100 - sVar2;
      if (inlen <= __n) {
        memcpy(block + sVar2,in,inlen);
        S->buflen = S->buflen + inlen;
        return 0;
      }
      memcpy(block + sVar2,in,__n);
      S->buflen = S->buflen + __n;
      uVar1 = S->t[0];
      S->t[0] = uVar1 + 0x80;
      S->t[1] = (S->t[1] + 1) - (ulong)(uVar1 < 0xffffffffffffff80);
      blake2b_compress(S,block);
      memcpy(block,S->buf + 0x80,0x80);
      sVar2 = S->buflen - 0x80;
      in = in + __n;
      S->buflen = sVar2;
      inlen = inlen - __n;
    } while (inlen != 0);
  }
  return 0;
}

Assistant:

int blake2b_update( blake2b_state *S, const uint8_t *in, uint64_t inlen )
{
  while( inlen > 0 )
  {
    size_t left = S->buflen;
    size_t fill = 2 * BLAKE2B_BLOCKBYTES - left;

    if( inlen > fill )
    {
      memcpy( S->buf + left, in, fill ); // Fill buffer
      S->buflen += fill;
      blake2b_increment_counter( S, BLAKE2B_BLOCKBYTES );
      blake2b_compress( S, S->buf ); // Compress
      memcpy( S->buf, S->buf + BLAKE2B_BLOCKBYTES, BLAKE2B_BLOCKBYTES ); // Shift buffer left
      S->buflen -= BLAKE2B_BLOCKBYTES;
      in += fill;
      inlen -= fill;
    }
    else // inlen <= fill
    {
      memcpy( S->buf + left, in, (size_t)inlen );
      S->buflen += (size_t)inlen; // Be lazy, do not compress
      in += inlen;
      inlen -= inlen;
    }
  }

  return 0;
}